

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *pNtkBase,Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_44;
  int local_40;
  int nBarBufs;
  int k;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  Abc_Ntk_t *pNtkBase_local;
  
  iVar1 = Abc_NtkIsLogic(pNtkBase);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtkBase)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1d3,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1d4,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = pNtkBase->nBarBufs;
  iVar2 = Abc_NtkLatchNum(pNtkBase);
  if (iVar1 != iVar2) {
    __assert_fail("pNtkBase->nBarBufs == Abc_NtkLatchNum(pNtkBase)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1d5,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtkBase,pNtk->ntkType,pNtk->ntkFunc);
  for (nBarBufs = 0; iVar1 = Abc_NtkPiNum(pNtk), nBarBufs < iVar1; nBarBufs = nBarBufs + 1) {
    pAVar3 = Abc_NtkPi(pNtk,nBarBufs);
    pAVar5 = Abc_NtkPi(pNtk_00,nBarBufs);
    (pAVar3->field_6).pCopy = pAVar5;
  }
  local_44 = 0;
  for (nBarBufs = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nBarBufs < iVar1; nBarBufs = nBarBufs + 1) {
    pAVar3 = Abc_NtkObj(pNtk,nBarBufs);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) {
      iVar1 = Abc_ObjIsBarBuf(pAVar3);
      if (iVar1 == 0) {
        Abc_NtkDupObj(pNtk_00,pAVar3,1);
        for (local_40 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_40 < iVar1;
            local_40 = local_40 + 1) {
          pAVar5 = Abc_ObjFanin(pAVar3,local_40);
          Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar5->field_6).pCopy);
        }
      }
      else {
        pAVar5 = Abc_NtkBox(pNtk_00,local_44);
        pObj_00 = Abc_ObjFanin0(pAVar5);
        pAVar4 = Abc_ObjFanin0(pAVar3);
        Abc_ObjAddFanin(pObj_00,(pAVar4->field_6).pCopy);
        pAVar5 = Abc_ObjFanout0(pAVar5);
        (pAVar3->field_6).pCopy = pAVar5;
        local_44 = local_44 + 1;
      }
    }
  }
  if (local_44 == pNtkBase->nBarBufs) {
    for (nBarBufs = 0; iVar1 = Abc_NtkPoNum(pNtk), nBarBufs < iVar1; nBarBufs = nBarBufs + 1) {
      pAVar3 = Abc_NtkPo(pNtk,nBarBufs);
      pAVar5 = Abc_NtkPo(pNtk_00,nBarBufs);
      pAVar3 = Abc_ObjFanin0(pAVar3);
      Abc_ObjAddFanin(pAVar5,(pAVar3->field_6).pCopy);
    }
    return pNtk_00;
  }
  __assert_fail("nBarBufs == pNtkBase->nBarBufs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                ,0x1ec,"Abc_Ntk_t *Abc_NtkBarBufsFromBuffers(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkBarBufsFromBuffers( Abc_Ntk_t * pNtkBase, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin, * pLatch;
    int i, k, nBarBufs;
    assert( Abc_NtkIsLogic(pNtkBase) );
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtkBase->nBarBufs == Abc_NtkLatchNum(pNtkBase) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtkBase, pNtk->ntkType, pNtk->ntkFunc );
    // transfer PI pointers
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPi(pNtkNew, i);
    // assuming that the order/number of barbufs remains the same
    nBarBufs = 0;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjIsBarBuf(pObj) )
        {
            pLatch = Abc_NtkBox(pNtkNew, nBarBufs++);
            Abc_ObjAddFanin( Abc_ObjFanin0(pLatch), Abc_ObjFanin0(pObj)->pCopy );
            pObj->pCopy = Abc_ObjFanout0(pLatch);
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 1 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    assert( nBarBufs == pNtkBase->nBarBufs );
    // connect POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAddFanin( Abc_NtkPo(pNtkNew, i), Abc_ObjFanin0(pObj)->pCopy );
    return pNtkNew;
}